

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

type unodb::qsbr_state::inc_epoch_reset_previous(type word)

{
  qsbr_epoch other;
  bool bVar1;
  qsbr_thread_count_type qVar2;
  qsbr_thread_count_type qVar3;
  qsbr_epoch local_41;
  ulong local_40;
  uint64_t result;
  uint64_t new_threads_in_previous;
  uint64_t new_thread_count_in_word;
  type local_20;
  type new_epoch_in_word;
  type tStack_10;
  qsbr_epoch old_epoch;
  type word_local;
  
  tStack_10 = word;
  assert_invariants(word);
  qVar2 = get_threads_in_previous_epoch(tStack_10);
  if (qVar2 != 0) {
    __assert_fail("get_threads_in_previous_epoch(word) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x157,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  new_epoch_in_word._7_1_ = get_epoch(tStack_10);
  new_thread_count_in_word._7_1_ =
       detail::qsbr_epoch::advance((qsbr_epoch *)((long)&new_epoch_in_word + 7),1);
  local_20 = make_from_epoch(new_thread_count_in_word._7_1_);
  new_threads_in_previous = tStack_10 & 0x3fffffff00000000;
  result = tStack_10 >> 0x20 & 0x3fffffff;
  local_40 = local_20 | new_threads_in_previous | result;
  local_41 = get_epoch(local_40);
  other = detail::qsbr_epoch::advance((qsbr_epoch *)((long)&new_epoch_in_word + 7),1);
  bVar1 = detail::qsbr_epoch::operator==(&local_41,other);
  if (!bVar1) {
    __assert_fail("get_epoch(result) == old_epoch.advance()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x161,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  qVar2 = get_thread_count(local_40);
  qVar3 = get_thread_count(tStack_10);
  if (qVar2 != qVar3) {
    __assert_fail("get_thread_count(result) == get_thread_count(word)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x162,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  qVar2 = get_threads_in_previous_epoch(local_40);
  qVar3 = get_thread_count(local_40);
  if (qVar2 == qVar3) {
    assert_invariants(local_40);
    return local_40;
  }
  __assert_fail("get_threads_in_previous_epoch(result) == get_thread_count(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x164,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_epoch_reset_previous(
      type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 0);

    const auto old_epoch = get_epoch(word);
    const auto new_epoch_in_word = make_from_epoch(old_epoch.advance());
    const auto new_thread_count_in_word = word & thread_count_in_word_mask;
    const auto new_threads_in_previous = (word >> thread_count_in_word_offset) &
                                         threads_in_previous_epoch_in_word_mask;
    const auto result =
        new_epoch_in_word | new_thread_count_in_word | new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(result) == old_epoch.advance());
    UNODB_DETAIL_ASSERT(get_thread_count(result) == get_thread_count(word));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }